

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::signal_handler(int signal_number,siginfo_t *param_2,void *param_3)

{
  char *pcVar1;
  undefined1 local_c0 [8];
  Message message;
  char preamble_buff [92];
  char *signal_name;
  void *param_2_local;
  siginfo_t *param_1_local;
  int signal_number_local;
  
  stack0xffffffffffffffd8 = "UNKNOWN SIGNAL";
  if (signal_number == 6) {
    stack0xffffffffffffffd8 = "SIGABRT";
  }
  if (signal_number == 7) {
    stack0xffffffffffffffd8 = "SIGBUS";
  }
  if (signal_number == 8) {
    stack0xffffffffffffffd8 = "SIGFPE";
  }
  if (signal_number == 4) {
    stack0xffffffffffffffd8 = "SIGILL";
  }
  if (signal_number == 2) {
    stack0xffffffffffffffd8 = "SIGINT";
  }
  if (signal_number == 0xb) {
    stack0xffffffffffffffd8 = "SIGSEGV";
  }
  if (signal_number == 0xf) {
    stack0xffffffffffffffd8 = "SIGTERM";
  }
  if (((g_colorlogtostderr & 1) != 0) && ((s_terminal_has_color & 1) != 0)) {
    pcVar1 = terminal_reset();
    write_to_stderr(pcVar1);
    pcVar1 = terminal_bold();
    write_to_stderr(pcVar1);
    pcVar1 = terminal_light_red();
    write_to_stderr(pcVar1);
  }
  write_to_stderr("\n");
  write_to_stderr("Loguru caught a signal: ");
  write_to_stderr(stack0xffffffffffffffd8);
  write_to_stderr("\n");
  if (((g_colorlogtostderr & 1) != 0) && ((s_terminal_has_color & 1) != 0)) {
    pcVar1 = terminal_reset();
    write_to_stderr(pcVar1);
  }
  if (((byte)s_signal_options & 1) != 0) {
    flush();
    print_preamble((char *)&message.message,0x5c,-3,"",0);
    local_c0._0_4_ = -3;
    message._0_8_ = (long)"\n\n\n\n\n" + 5;
    message.filename._0_4_ = 0;
    message.preamble = "";
    message.indentation = "Signal: ";
    message.prefix = stack0xffffffffffffffd8;
    message._16_8_ = &message.message;
    log_message(1,(Message *)local_c0,false,false);
    flush();
  }
  call_default_signal_handler(signal_number);
  return;
}

Assistant:

void signal_handler(int signal_number, siginfo_t*, void*)
	{
		const char* signal_name = "UNKNOWN SIGNAL";

		if (signal_number == SIGABRT) { signal_name = "SIGABRT"; }
		if (signal_number == SIGBUS)  { signal_name = "SIGBUS";  }
		if (signal_number == SIGFPE)  { signal_name = "SIGFPE";  }
		if (signal_number == SIGILL)  { signal_name = "SIGILL";  }
		if (signal_number == SIGINT)  { signal_name = "SIGINT";  }
		if (signal_number == SIGSEGV) { signal_name = "SIGSEGV"; }
		if (signal_number == SIGTERM) { signal_name = "SIGTERM"; }

		// --------------------------------------------------------------------
		/* There are few things that are safe to do in a signal handler,
		   but writing to stderr is one of them.
		   So we first print out what happened to stderr so we're sure that gets out,
		   then we do the unsafe things, like logging the stack trace.
		*/

		if (g_colorlogtostderr && s_terminal_has_color) {
			write_to_stderr(terminal_reset());
			write_to_stderr(terminal_bold());
			write_to_stderr(terminal_light_red());
		}
		write_to_stderr("\n");
		write_to_stderr("Loguru caught a signal: ");
		write_to_stderr(signal_name);
		write_to_stderr("\n");
		if (g_colorlogtostderr && s_terminal_has_color) {
			write_to_stderr(terminal_reset());
		}

		// --------------------------------------------------------------------

		if (s_signal_options.unsafe_signal_handler) {
			// --------------------------------------------------------------------
			/* Now we do unsafe things. This can for example lead to deadlocks if
			   the signal was triggered from the system's memory management functions
			   and the code below tries to do allocations.
			*/

			flush();
			char preamble_buff[LOGURU_PREAMBLE_WIDTH];
			print_preamble(preamble_buff, sizeof(preamble_buff), Verbosity_FATAL, "", 0);
			auto message = Message{Verbosity_FATAL, "", 0, preamble_buff, "", "Signal: ", signal_name};
			try {
				log_message(1, message, false, false);
			} catch (...) {
				// This can happed due to s_fatal_handler.
				write_to_stderr("Exception caught and ignored by Loguru signal handler.\n");
			}
			flush();

			// --------------------------------------------------------------------
		}

		call_default_signal_handler(signal_number);
	}